

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O3

Aig_ManPack_t * Aig_ManPackAlloc(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Aig_ManPack_t *pAVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  word *__s;
  
  pAVar3 = (Aig_ManPack_t *)calloc(1,0x38);
  pAVar3->pAig = pAig;
  iVar1 = pAig->vObjs->nSize;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar2 = iVar1;
  if (iVar1 - 1U < 0xf) {
    iVar2 = 0x10;
  }
  pVVar4->nCap = iVar2;
  if (iVar2 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar2 << 3);
  }
  pVVar4->pArray = pwVar5;
  pVVar4->nSize = iVar1;
  __s = (word *)0x0;
  memset(pwVar5,0,(long)iVar1 << 3);
  pAVar3->vSigns = pVVar4;
  iVar1 = pAig->nObjs[2];
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  pVVar4->nCap = iVar2;
  if (iVar2 != 0) {
    __s = (word *)malloc((long)iVar2 * 8);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  pwVar5 = (word *)0x0;
  memset(__s,0,(long)iVar1 << 3);
  pAVar3->vPiPats = pVVar4;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = iVar2;
  if (iVar2 != 0) {
    pwVar5 = (word *)malloc((long)iVar2 << 3);
  }
  pVVar4->pArray = pwVar5;
  pVVar4->nSize = iVar1;
  memset(pwVar5,0,(long)iVar1 << 3);
  pAVar3->vPiCare = pVVar4;
  pAVar3->iPatCur = 1;
  return pAVar3;
}

Assistant:

Aig_ManPack_t * Aig_ManPackAlloc( Aig_Man_t * pAig )
{
    Aig_ManPack_t * p;
    p = ABC_CALLOC( Aig_ManPack_t, 1 );
    p->pAig    = pAig;
    p->vSigns  = Vec_WrdStart( Aig_ManObjNumMax(pAig) );
    p->vPiPats = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->vPiCare = Vec_WrdStart( Aig_ManCiNum(pAig) );
    p->iPatCur = 1;
    return p;
}